

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_io_test.cc
# Opt level: O2

void __thiscall UnitTest_TestEqual_Test::UnitTest_TestEqual_Test(UnitTest_TestEqual_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016df78;
  return;
}

Assistant:

TEST(UnitTest, TestEqual)
{
	Qiniu_Eq eq;
	Qiniu_Seq seq, seq2;
	Qiniu_Section sect;

	Qiniu_ReaderAt in = Qiniu_SeqReaderAt(&seq, (size_t)fsize, 10, '0', 0);
	Qiniu_Reader r = Qiniu_SectionReader(&sect, in, 0, (off_t)fsize);

	Qiniu_Reader in2 = Qiniu_SeqReader(&seq2, (size_t)fsize, 10, '0', 0);
	Qiniu_Writer w = Qiniu_EqWriter(&eq, in2);

	Qiniu_Int64 ncopy;
	Qiniu_Error err = Qiniu_Copy(w, r, NULL, 1024, &ncopy);
	EXPECT_EQ(err.code, 200);
	EXPECT_EQ(ncopy, fsize);
	EXPECT_TRUE(Qiniu_Is(&eq));
}